

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O2

void __thiscall QRingChunk::detach(QRingChunk *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  long size;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  size = this->tailOffset - this->headOffset;
  pcVar3 = (this->chunk).d.ptr;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "";
  }
  QByteArray::QByteArray((QByteArray *)&local_38,pcVar3 + this->headOffset,size);
  pDVar2 = (this->chunk).d.d;
  pcVar3 = (this->chunk).d.ptr;
  (this->chunk).d.d = local_38.d;
  (this->chunk).d.ptr = local_38.ptr;
  qVar1 = (this->chunk).d.size;
  (this->chunk).d.size = local_38.size;
  local_38.d = pDVar2;
  local_38.ptr = pcVar3;
  local_38.size = qVar1;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  this->headOffset = 0;
  this->tailOffset = size;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRingChunk::detach()
{
    Q_ASSERT(isShared());

    const qsizetype chunkSize = size();
    chunk = QByteArray(std::as_const(*this).data(), chunkSize);
    headOffset = 0;
    tailOffset = chunkSize;
}